

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_handle.cpp
# Opt level: O1

SteadyTimer __thiscall
miniros::NodeHandle::createSteadyTimer(NodeHandle *this,SteadyTimerOptions *ops)

{
  CallbackQueue *pCVar1;
  SteadyTimerOptions *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  SteadyTimer SVar3;
  
  if (in_RDX->callback_queue == (CallbackQueueInterface *)0x0) {
    pCVar1 = *(CallbackQueue **)((long)&ops[2].callback.super__Function_base._M_functor + 8);
    if (pCVar1 == (CallbackQueue *)0x0) {
      pCVar1 = getGlobalCallbackQueue();
    }
    in_RDX->callback_queue = &pCVar1->super_CallbackQueueInterface;
  }
  SteadyTimer::SteadyTimer((SteadyTimer *)this,in_RDX);
  _Var2._M_pi = extraout_RDX;
  if (in_RDX->autostart == true) {
    SteadyTimer::start((SteadyTimer *)this);
    _Var2._M_pi = extraout_RDX_00;
  }
  SVar3.impl_.super___shared_ptr<miniros::SteadyTimer::Impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Var2._M_pi;
  SVar3.impl_.super___shared_ptr<miniros::SteadyTimer::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (SteadyTimer)
         SVar3.impl_.super___shared_ptr<miniros::SteadyTimer::Impl,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SteadyTimer NodeHandle::createSteadyTimer(SteadyTimerOptions& ops) const
{
  if (ops.callback_queue == 0)
  {
    if (callback_queue_)
    {
      ops.callback_queue = callback_queue_;
    }
    else
    {
      ops.callback_queue = getGlobalCallbackQueue();
    }
  }

  SteadyTimer timer(ops);
  if (ops.autostart)
    timer.start();
  return timer;
}